

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O1

CURLcode libcurl_generate_slist(curl_slist *slist,int *slistno)

{
  CURLcode CVar1;
  char *__ptr;
  
  easysrc_slist_count = easysrc_slist_count + 1;
  *slistno = easysrc_slist_count;
  __ptr = (char *)0x0;
  CVar1 = easysrc_addf(&easysrc_decl,"struct curl_slist *slist%d;");
  if (CVar1 == CURLE_OK) {
    __ptr = (char *)0x0;
    CVar1 = easysrc_addf(&easysrc_data,"slist%d = NULL;",(ulong)(uint)*slistno);
    if (CVar1 == CURLE_OK) {
      __ptr = (char *)0x0;
      CVar1 = easysrc_addf(&easysrc_clean,"curl_slist_free_all(slist%d);",(ulong)(uint)*slistno);
      if (CVar1 == CURLE_OK) {
        __ptr = (char *)0x0;
        CVar1 = easysrc_addf(&easysrc_clean,"slist%d = NULL;",(ulong)(uint)*slistno);
        if (slist != (curl_slist *)0x0 && CVar1 == CURLE_OK) {
          __ptr = (char *)0x0;
          do {
            free(__ptr);
            __ptr = c_escape(slist->data,-1);
            if (__ptr == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            CVar1 = easysrc_addf(&easysrc_data,"slist%d = curl_slist_append(slist%d, \"%s\");",
                                 (ulong)(uint)*slistno,(ulong)(uint)*slistno,__ptr);
            if (CVar1 != CURLE_OK) break;
            slist = slist->next;
            CVar1 = CURLE_OK;
          } while (slist != (curl_slist *)0x0);
        }
      }
    }
  }
  free(__ptr);
  return CVar1;
}

Assistant:

static CURLcode libcurl_generate_slist(struct curl_slist *slist, int *slistno)
{
  CURLcode ret = CURLE_OK;
  char *escaped = NULL;

  /* May need several slist variables, so invent name */
  *slistno = ++easysrc_slist_count;

  DECL1("struct curl_slist *slist%d;", *slistno);
  DATA1("slist%d = NULL;", *slistno);
  CLEAN1("curl_slist_free_all(slist%d);", *slistno);
  CLEAN1("slist%d = NULL;", *slistno);
  for(; slist; slist = slist->next) {
    Curl_safefree(escaped);
    escaped = c_escape(slist->data, ZERO_TERMINATED);
    if(!escaped)
      return CURLE_OUT_OF_MEMORY;
    DATA3("slist%d = curl_slist_append(slist%d, \"%s\");",
                                       *slistno, *slistno, escaped);
  }

 nomem:
  Curl_safefree(escaped);
  return ret;
}